

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimples.cpp
# Opt level: O1

double pce(Mat *input)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  _InputArray *p_Var4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double maxValue;
  Point minLoc;
  Point maxLoc;
  double minValue;
  Mat roi;
  Mat res_pce;
  Mat T;
  Mat T_;
  undefined8 local_1e8;
  undefined8 local_1e0;
  ulong local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  double local_1c0;
  uint local_1b8;
  uint local_1b4;
  _InputArray local_1b0 [3];
  long *local_168;
  Mat local_150 [16];
  long local_140;
  long *local_108;
  Mat local_f0 [16];
  long local_e0;
  long *local_a8;
  uint local_90 [4];
  undefined8 *local_80;
  
  cv::Mat::Mat((Mat *)local_90,8,8,6);
  *local_80 = 0x3ff0000000000000;
  cv::Mat::Mat(local_f0,8,8,local_90[0] & 0xfff);
  zero_mean((Mat *)local_90,local_f0);
  iVar2 = *(int *)(input + 8);
  iVar3 = *(int *)(input + 0xc);
  uVar5 = iVar2 - 8;
  uVar1 = iVar3 - 8;
  local_1b8 = uVar5;
  local_1b4 = uVar1;
  cv::Mat::Mat(local_150,&local_1b8,6);
  if (8 < iVar3) {
    local_1d8 = (ulong)uVar1;
    uVar9 = 0;
    do {
      if (8 < iVar2) {
        uVar6 = 0;
        do {
          local_1e8._0_4_ = (undefined4)uVar9;
          local_1e8._4_4_ = (undefined4)uVar6;
          local_1e0 = 0x800000008;
          cv::Mat::Mat((Mat *)local_1b0,input,(Rect_ *)&local_1e8);
          if ((long)(int)local_1b0[0].obj < 1) {
            dVar10 = 0.0;
          }
          else {
            dVar10 = 0.0;
            lVar7 = 0;
            do {
              if (0 < (int)local_1b0[0].obj._4_4_) {
                uVar8 = 0;
                do {
                  dVar10 = dVar10 + *(double *)
                                     (*local_168 * lVar7 + (long)local_1b0[0].sz + uVar8 * 8) *
                                    *(double *)(*local_a8 * lVar7 + local_e0 + uVar8 * 8);
                  uVar8 = uVar8 + 1;
                } while (local_1b0[0].obj._4_4_ != uVar8);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != (int)local_1b0[0].obj);
          }
          *(double *)(*local_108 * uVar6 + local_140 + uVar9 * 8) = dVar10;
          cv::Mat::~Mat((Mat *)local_1b0);
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar5);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_1d8);
  }
  local_1c8 = 0;
  local_1d0 = 0;
  local_1b0[0].sz.width = 0;
  local_1b0[0].sz.height = 0;
  local_1b0[0].flags = 0x1010000;
  local_1b0[0].obj = local_150;
  p_Var4 = (_InputArray *)cv::noArray();
  cv::minMaxLoc(local_1b0,&local_1c0,(double *)&local_1e8,(Point_ *)&local_1d0,(Point_ *)&local_1c8,
                p_Var4);
  dVar10 = (double)CONCAT44(local_1e8._4_4_,(undefined4)local_1e8);
  cv::Mat::~Mat(local_150);
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat((Mat *)local_90);
  return dVar10;
}

Assistant:

double pce(const Mat &input)
{
    //设置8*8的模板
    Mat T_ = Mat(8, 8, CV_64FC1);
    T_.at<double>(0,0) = 1.0;
    Mat T=Mat(8, 8, T_.type());
    zero_mean(T_,T);
//    cout<<T<<endl;
    
    int rows = input.rows;
    int cols = input.cols;
    Mat res_pce = Mat(Size(rows-8,cols-8),CV_64FC1);
    
    for(int j = 0;j<cols-8;j++)
    {
        for(int i = 0;i<rows-8;i++)
        {
            Rect r= Rect(j,i,8,8);
            Mat roi = input(r);
            res_pce.at<double>(i,j)=multiplyAdd(roi,T);
        }
    }
    //找到所有PCE值里面最大的
    double maxValue,minValue;
    Point maxLoc,minLoc;
    minMaxLoc(res_pce,&minValue,&maxValue, &minLoc, &maxLoc);
    return maxValue;
}